

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::ReleaseMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  Message *this_00;
  Arena *pAVar1;
  Message *copy_from_arena;
  Message *released;
  MessageFactory *factory_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  anon_unknown_0::CheckInvalidAccess(&this->schema_,field);
  this_00 = UnsafeArenaReleaseMessage(this,message,field,factory);
  pAVar1 = MessageLite::GetArenaForAllocation(&message->super_MessageLite);
  copy_from_arena = this_00;
  if ((pAVar1 != (Arena *)0x0) && (this_00 != (Message *)0x0)) {
    copy_from_arena = Message::New(this_00);
    (*(copy_from_arena->super_MessageLite)._vptr_MessageLite[0xd])(copy_from_arena,this_00);
  }
  return copy_from_arena;
}

Assistant:

Message* Reflection::ReleaseMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  CheckInvalidAccess(schema_, field);

  Message* released = UnsafeArenaReleaseMessage(message, field, factory);
#ifdef PROTOBUF_FORCE_COPY_IN_RELEASE
  released = MaybeForceCopy(message->GetArenaForAllocation(), released);
#endif  // PROTOBUF_FORCE_COPY_IN_RELEASE
  if (message->GetArenaForAllocation() != nullptr && released != nullptr) {
    Message* copy_from_arena = released->New();
    copy_from_arena->CopyFrom(*released);
    released = copy_from_arena;
  }
  return released;
}